

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::PageHeapLockPages(LargeHeapBlock *this)

{
  byte *pbVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  PageHeapData *pPVar6;
  undefined8 *in_FS_OFFSET;
  DWORD local_1c [2];
  DWORD oldProtect;
  
  pPVar6 = this->pageHeapData;
  if (pPVar6->isLockedWithPageHeap == false) {
    if (this->allocCount != 0) {
      if (this->allocCount != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x94d,"(this->allocCount == 1)","this->allocCount == 1");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      VerifyPageHeapPattern(this);
      pPVar6 = this->pageHeapData;
    }
    pPVar6->objectAddress[-6] = pPVar6->objectAddress[-6] | 4;
    BVar5 = VirtualProtect(this->pageHeapData->objectPageAddr,this->pageCount << 0xc,2,local_1c);
    if (BVar5 == 0) {
      pbVar1 = (byte *)(this->pageHeapData->objectAddress + -6);
      *pbVar1 = *pbVar1 & 0xfb;
    }
    else {
      this->pageHeapData->isLockedWithPageHeap = true;
    }
  }
  return;
}

Assistant:

void 
LargeHeapBlock::PageHeapLockPages()
{
    if (!pageHeapData->isLockedWithPageHeap)
    {
        if (this->allocCount > 0) // in case OOM while adding heapblock to heapBlockMap, we release page before setting the pattern
        {
            Assert(this->allocCount == 1); // one object per heapblock in pageheap
            VerifyPageHeapPattern();
        }

        DWORD oldProtect;
        GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = true;
        if (VirtualProtect(pageHeapData->objectPageAddr, this->pageCount * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect))
        {
            pageHeapData->isLockedWithPageHeap = true;
        }
        else
        {
            GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = false;
        }
    }
}